

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Status __thiscall
google::protobuf::compiler::cpp::CppGenerator::ValidateFeatures
          (CppGenerator *this,FileDescriptor *file)

{
  Descriptor *descriptor;
  EnumDescriptor *this_00;
  FieldDescriptor *descriptor_00;
  ServiceDescriptor *this_01;
  FileDescriptor *in_RDX;
  int i;
  int iVar1;
  uint index;
  EnumDescriptor *descriptor_01;
  int i_4;
  int index_00;
  anon_class_8_1_6bf1c130 local_30;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)0x1;
  local_30.status = (Status *)this;
  for (iVar1 = 0; iVar1 < in_RDX->message_type_count_; iVar1 = iVar1 + 1) {
    descriptor = FileDescriptor::message_type(in_RDX,iVar1);
    protobuf::internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/generator.cc:365:55)>_>
    ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_cpp_generator_cc:365:55)>_>
               *)&local_30,descriptor);
  }
  for (index = 0; (int)index < in_RDX->enum_type_count_; index = index + 1) {
    descriptor_01 = (EnumDescriptor *)(ulong)index;
    this_00 = FileDescriptor::enum_type(in_RDX,index);
    protobuf::internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/generator.cc:365:55)>_>
    ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_cpp_generator_cc:365:55)>_>
               *)this_00,descriptor_01);
  }
  for (iVar1 = 0; iVar1 < in_RDX->extension_count_; iVar1 = iVar1 + 1) {
    descriptor_00 = FileDescriptor::extension(in_RDX,iVar1);
    protobuf::internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/generator.cc:365:55)>_>
    ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_cpp_generator_cc:365:55)>_>
               *)&local_30,descriptor_00);
  }
  for (iVar1 = 0; iVar1 < in_RDX->service_count_; iVar1 = iVar1 + 1) {
    this_01 = FileDescriptor::service(in_RDX,iVar1);
    for (index_00 = 0; index_00 < this_01->method_count_; index_00 = index_00 + 1) {
      ServiceDescriptor::method(this_01,index_00);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status CppGenerator::ValidateFeatures(const FileDescriptor* file) const {
  absl::Status status = absl::OkStatus();
  google::protobuf::internal::VisitDescriptors(*file, [&](const FieldDescriptor& field) {
    const FeatureSet& resolved_features = GetResolvedSourceFeatures(field);
    const pb::CppFeatures& unresolved_features =
        GetUnresolvedSourceFeatures(field, pb::cpp);
    if (field.enum_type() != nullptr &&
        resolved_features.GetExtension(::pb::cpp).legacy_closed_enum() &&
        resolved_features.field_presence() == FeatureSet::IMPLICIT) {
      status = absl::FailedPreconditionError(
          absl::StrCat("Field ", field.full_name(),
                       " has a closed enum type with implicit presence."));
    }

    if (field.containing_type() == nullptr ||
        !field.containing_type()->options().map_entry()) {
      // Skip validation of explicit features on generated map fields.  These
      // will be blindly propagated from the original map field, and may violate
      // a lot of these conditions.  Note: we do still validate the
      // user-specified map field.
      if (unresolved_features.has_legacy_closed_enum() &&
          field.cpp_type() != FieldDescriptor::CPPTYPE_ENUM &&
          !IsEnumMapType(field)) {
        status = absl::FailedPreconditionError(
            absl::StrCat("Field ", field.full_name(),
                         " specifies the legacy_closed_enum feature but has "
                         "non-enum type."));
      }
    }

    if ((unresolved_features.string_type() == pb::CppFeatures::CORD ||
         field.legacy_proto_ctype() == FieldOptions::CORD) &&
        field.is_extension()) {
      status = absl::FailedPreconditionError(
          absl::StrCat("Extension ", field.full_name(),
                       " specifies CORD string type which is not supported "
                       "for extensions."));
    }

    if ((unresolved_features.has_string_type() ||
         field.has_legacy_proto_ctype()) &&
        field.cpp_type() != FieldDescriptor::CPPTYPE_STRING) {
      status = absl::FailedPreconditionError(absl::StrCat(
          "Field ", field.full_name(),
          " specifies string_type, but is not a string nor bytes field."));
    }

    if (unresolved_features.has_string_type() &&
        field.has_legacy_proto_ctype()) {
      status = absl::FailedPreconditionError(absl::StrCat(
          "Field ", field.full_name(),
          " specifies both string_type and ctype which is not supported."));
    }
  });
  return status;
}